

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
::resize(raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  allocator<std::pair<const_Int,_Int>_> *alloc;
  slot_type *pptVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  ctrl_t *__s;
  ulong uVar3;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  Layout LVar6;
  FindInfo FVar7;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::resize(size_t) [Policy = phmap::priv::NodeHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                 );
  }
  alloc = (allocator<std::pair<const_Int,_Int>_> *)this->ctrl_;
  pptVar1 = this->slots_;
  capacity = this->capacity_;
  LVar6 = MakeLayout(new_capacity);
  uVar5 = LVar6.super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_Int,_Int>_*>.size_[0] +
          7 & 0xfffffffffffffff8;
  uVar3 = LVar6.super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_Int,_Int>_*>.size_[1] *
          8 + uVar5;
  if (uVar3 == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const Int, Int>>]"
                 );
  }
  if (-1 < (long)uVar3) {
    __s = (ctrl_t *)operator_new(uVar3);
    if (((ulong)__s & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0x1064,
                    "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const Int, Int>>]"
                   );
    }
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)(__s + uVar5);
    memset(__s,0x80,new_capacity + 0x10);
    __s[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    this->capacity_ = new_capacity;
    for (sVar4 = 0; capacity != sVar4; sVar4 = sVar4 + 1) {
      if (-1 < (char)alloc[sVar4]) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (pptVar1[sVar4]->first).value;
        hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                  SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
        FVar7 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar7.offset,(byte)hashval & 0x7f);
        this->slots_[FVar7.offset] = pptVar1[sVar4];
      }
    }
    if (capacity != 0) {
      LVar6 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
                (alloc,(void *)((LVar6.
                                 super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_Int,_Int>_*>
                                 .size_[0] + 7 & 0xfffffffffffffff8) +
                               LVar6.
                               super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_Int,_Int>_*>
                               .size_[1] * 8),
                 LVar6.super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_Int,_Int>_*>.
                 size_[1]);
      return;
    }
    return;
  }
  std::__throw_bad_alloc();
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }